

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VRMain.cpp
# Opt level: O0

void __thiscall MinVR::VRMain::setConfigValue(VRMain *this,string *keyAndValStr)

{
  long lVar1;
  string name;
  string *in_stack_000000a0;
  VRDataIndex *in_stack_000000a8;
  string str;
  string local_f0 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff20;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff28;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff30;
  char *in_stack_ffffffffffffff38;
  string local_a8 [55];
  allocator<char> local_71;
  string local_70 [32];
  string local_50 [32];
  string local_30 [48];
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffff30,(char *)in_stack_ffffffffffffff28,
             (allocator<char> *)in_stack_ffffffffffffff20);
  std::operator+(in_stack_ffffffffffffff38,in_stack_ffffffffffffff30);
  std::operator+(in_stack_ffffffffffffff28,in_stack_ffffffffffffff20);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffff30,(char *)in_stack_ffffffffffffff28,
             (allocator<char> *)in_stack_ffffffffffffff20);
  std::operator+(in_stack_ffffffffffffff28,in_stack_ffffffffffffff20);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffff38);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff37);
  std::__cxx11::string::~string(local_50);
  std::__cxx11::string::~string(local_a8);
  std::__cxx11::string::~string(local_70);
  std::allocator<char>::~allocator(&local_71);
  lVar1 = std::__cxx11::string::c_str();
  std::__cxx11::string::size();
  std::ostream::write((char *)&std::cout,lVar1);
  std::__cxx11::string::~string(local_30);
  VRDataIndex::addData(in_stack_000000a8,in_stack_000000a0);
  std::__cxx11::string::~string(local_f0);
  return;
}

Assistant:

void VRMain::setConfigValue(const std::string &keyAndValStr) {
  VRLOG_STATUS("Setting config value:" + keyAndValStr);
  std::string name = _config->addData(keyAndValStr);
}